

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O2

REF_STATUS
ref_search_gather(REF_SEARCH ref_search,REF_LIST ref_list,REF_INT parent,REF_DBL *position,
                 REF_DBL radius)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  uVar1 = 0;
  if (parent != -1 && ref_search->n != 0) {
    if (parent < 0 || ref_search->n <= parent) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0xc6
             ,"ref_search_gather","parent invalid");
      printf("%d n %d parent\n",(ulong)(uint)ref_search->n,(ulong)(uint)parent);
      uVar1 = 1;
    }
    else if (ref_search->item[(uint)parent] != -1) {
      uVar1 = ref_search->d;
      uVar4 = 0;
      uVar3 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar3 = uVar4;
      }
      dVar5 = 0.0;
      for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        dVar6 = position[uVar4] - ref_search->pos[(long)(int)(parent * uVar1) + uVar4];
        dVar5 = dVar5 + dVar6 * dVar6;
      }
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      if ((dVar5 <= ref_search->radius[(uint)parent] + radius) &&
         (uVar1 = ref_list_push(ref_list,ref_search->item[(uint)parent]), uVar1 != 0)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
               0xd2,"ref_search_gather",(ulong)uVar1,"add item");
        return uVar1;
      }
      uVar1 = 0;
      if (dVar5 - radius <= ref_search->children_ball[(uint)parent]) {
        uVar1 = ref_search_gather(ref_search,ref_list,ref_search->left[(uint)parent],position,radius
                                 );
        if (uVar1 == 0) {
          uVar2 = ref_search_gather(ref_search,ref_list,ref_search->right[(uint)parent],position,
                                    radius);
          uVar1 = 0;
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                   ,0xdd,"ref_search_gather",(ulong)uVar2,"gthr");
            uVar1 = uVar2;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
                 0xda,"ref_search_gather",(ulong)uVar1,"gthr");
        }
      }
    }
  }
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_search_gather(REF_SEARCH ref_search,
                                            REF_LIST ref_list, REF_INT parent,
                                            REF_DBL *position, REF_DBL radius) {
  REF_INT i;
  REF_DBL distance;

  if (0 == ref_search->n) return REF_SUCCESS;  /* tree empty */
  if (REF_EMPTY == parent) return REF_SUCCESS; /* finished traversing */
  RAB(0 <= parent && parent < ref_search->n, "parent invalid",
      { printf("%d n %d parent\n", ref_search->n, parent); })
  /* finished traversing */
  if (REF_EMPTY == ref_search->item[parent]) return REF_SUCCESS;

  distance = 0.0;
  for (i = 0; i < ref_search->d; i++)
    distance +=
        pow(position[i] - ref_search->pos[i + ref_search->d * parent], 2);
  distance = sqrt(distance);

  /* if the distance between me and the target are less than combined radii */
  if (distance <= ref_search->radius[parent] + radius) {
    RSS(ref_list_push(ref_list, ref_search->item[parent]), "add item");
  }

  /* if the distance between me and the target are less than children
   * children_ball includes child radii, so only subtract target radius */
  if (distance - radius <= ref_search->children_ball[parent]) {
    RSS(ref_search_gather(ref_search, ref_list, ref_search->left[parent],
                          position, radius),
        "gthr");
    RSS(ref_search_gather(ref_search, ref_list, ref_search->right[parent],
                          position, radius),
        "gthr");
  }

  return REF_SUCCESS;
}